

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManReportImprovement(Gia_Man_t *p,Gia_Man_t *pNew)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double local_48;
  double local_28;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  uVar1 = Gia_ManRegNum(p);
  uVar2 = Gia_ManRegNum(pNew);
  iVar3 = Gia_ManRegNum(p);
  if (iVar3 == 0) {
    local_28 = 0.0;
  }
  else {
    iVar3 = Gia_ManRegNum(p);
    iVar4 = Gia_ManRegNum(pNew);
    iVar5 = Gia_ManRegNum(p);
    local_28 = ((double)(iVar3 - iVar4) * 100.0) / (double)iVar5;
  }
  Abc_Print(1,"REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",local_28,(ulong)uVar1,(ulong)uVar2);
  uVar1 = Gia_ManAndNum(p);
  uVar2 = Gia_ManAndNum(pNew);
  iVar3 = Gia_ManAndNum(p);
  if (iVar3 == 0) {
    local_48 = 0.0;
  }
  else {
    iVar3 = Gia_ManAndNum(p);
    iVar4 = Gia_ManAndNum(pNew);
    iVar5 = Gia_ManAndNum(p);
    local_48 = ((double)(iVar3 - iVar4) * 100.0) / (double)iVar5;
  }
  Abc_Print(1,"AND: Beg = %6d. End = %6d. (R =%5.1f %%)",local_48,(ulong)uVar1,(ulong)uVar2);
  Abc_Print(1,"\n");
  return;
}

Assistant:

void Gia_ManReportImprovement( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Abc_Print( 1, "REG: Beg = %5d. End = %5d. (R =%5.1f %%)  ",
        Gia_ManRegNum(p), Gia_ManRegNum(pNew),
        Gia_ManRegNum(p)? 100.0*(Gia_ManRegNum(p)-Gia_ManRegNum(pNew))/Gia_ManRegNum(p) : 0.0 );
    Abc_Print( 1, "AND: Beg = %6d. End = %6d. (R =%5.1f %%)",
        Gia_ManAndNum(p), Gia_ManAndNum(pNew),
        Gia_ManAndNum(p)? 100.0*(Gia_ManAndNum(p)-Gia_ManAndNum(pNew))/Gia_ManAndNum(p) : 0.0 );
    Abc_Print( 1, "\n" );
}